

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

int epoll_dispatch(event_base *base,timeval *tv)

{
  uint uVar1;
  undefined8 *puVar2;
  epoll_event *__events;
  int iVar3;
  uint uVar4;
  int *piVar5;
  void *pvVar6;
  epoll_event *new_events;
  ushort local_66;
  int new_nevents;
  undefined1 auStack_60 [2];
  short ev;
  int what;
  itimerspec is;
  long timeout;
  int res;
  int i;
  epoll_event *events;
  epollop *epollop;
  timeval *tv_local;
  event_base *base_local;
  
  puVar2 = (undefined8 *)base->evbase;
  __events = (epoll_event *)*puVar2;
  is.it_value.tv_nsec = -1;
  if (*(int *)(puVar2 + 2) < 0) {
    if ((tv != (timeval *)0x0) &&
       ((is.it_value.tv_nsec = evutil_tv_to_msec_(tv), is.it_value.tv_nsec < 0 ||
        (2100000 < is.it_value.tv_nsec)))) {
      is.it_value.tv_nsec =
           (__syscall_slong_t)
           std::
           __shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
           ::__shared_ptr;
    }
  }
  else {
    _auStack_60 = 0;
    is.it_interval.tv_sec = 0;
    if (tv == (timeval *)0x0) {
      is.it_interval.tv_nsec = 0;
      is.it_value.tv_sec = 0;
    }
    else {
      if ((tv->tv_sec == 0) && (tv->tv_usec == 0)) {
        is.it_value.tv_nsec = 0;
      }
      is.it_interval.tv_nsec = tv->tv_sec;
      is.it_value.tv_sec = tv->tv_usec * 1000;
    }
    iVar3 = timerfd_settime(*(int *)(puVar2 + 2),0,(itimerspec *)auStack_60,(itimerspec *)0x0);
    if (iVar3 < 0) {
      event_warn("timerfd_settime");
    }
  }
  epoll_apply_changes(base);
  event_changelist_remove_all_(&base->changelist,base);
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  uVar4 = epoll_wait(*(int *)((long)puVar2 + 0xc),__events,*(int *)(puVar2 + 1),
                     (int)is.it_value.tv_nsec);
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (uVar4 == 0xffffffff) {
    piVar5 = __errno_location();
    if (*piVar5 == 4) {
      base_local._4_4_ = 0;
    }
    else {
      event_warn("epoll_wait");
      base_local._4_4_ = -1;
    }
  }
  else {
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("%s: epoll_wait reports %d","epoll_dispatch",(ulong)uVar4);
    }
    if (*(int *)(puVar2 + 1) < (int)uVar4) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/epoll.c"
                 ,0x1df,"res <= epollop->nevents","epoll_dispatch");
    }
    for (timeout._4_4_ = 0; timeout._4_4_ < (int)uVar4; timeout._4_4_ = timeout._4_4_ + 1) {
      uVar1 = (&__events->events)[(long)timeout._4_4_ * 3];
      local_66 = 0;
      if (*(int *)(&__events->field_0x4 + (long)timeout._4_4_ * 0xc) != *(int *)(puVar2 + 2)) {
        if ((uVar1 & 0x18) == 0) {
          if ((uVar1 & 1) != 0) {
            local_66 = 2;
          }
          if ((uVar1 & 4) != 0) {
            local_66 = local_66 | 4;
          }
          if ((uVar1 & 0x2000) != 0) {
            local_66 = local_66 | 0x80;
          }
        }
        else {
          local_66 = 6;
        }
        if (local_66 != 0) {
          evmap_io_active_(base,*(int *)(&__events->field_0x4 + (long)timeout._4_4_ * 0xc),
                           local_66 | 0x20);
        }
      }
    }
    if ((uVar4 == *(uint *)(puVar2 + 1)) && (*(int *)(puVar2 + 1) < 0x1000)) {
      iVar3 = *(int *)(puVar2 + 1);
      pvVar6 = event_mm_realloc_((void *)*puVar2,(long)(iVar3 << 1) * 0xc);
      if (pvVar6 != (void *)0x0) {
        *puVar2 = pvVar6;
        *(int *)(puVar2 + 1) = iVar3 << 1;
      }
    }
    base_local._4_4_ = 0;
  }
  return base_local._4_4_;
}

Assistant:

static int
epoll_dispatch(struct event_base *base, struct timeval *tv)
{
	struct epollop *epollop = base->evbase;
	struct epoll_event *events = epollop->events;
	int i, res;
	long timeout = -1;

#ifdef USING_TIMERFD
	if (epollop->timerfd >= 0) {
		struct itimerspec is;
		is.it_interval.tv_sec = 0;
		is.it_interval.tv_nsec = 0;
		if (tv == NULL) {
			/* No timeout; disarm the timer. */
			is.it_value.tv_sec = 0;
			is.it_value.tv_nsec = 0;
		} else {
			if (tv->tv_sec == 0 && tv->tv_usec == 0) {
				/* we need to exit immediately; timerfd can't
				 * do that. */
				timeout = 0;
			}
			is.it_value.tv_sec = tv->tv_sec;
			is.it_value.tv_nsec = tv->tv_usec * 1000;
		}
		/* TODO: we could avoid unnecessary syscalls here by only
		   calling timerfd_settime when the top timeout changes, or
		   when we're called with a different timeval.
		*/
		if (timerfd_settime(epollop->timerfd, 0, &is, NULL) < 0) {
			event_warn("timerfd_settime");
		}
	} else
#endif
	if (tv != NULL) {
		timeout = evutil_tv_to_msec_(tv);
		if (timeout < 0 || timeout > MAX_EPOLL_TIMEOUT_MSEC) {
			/* Linux kernels can wait forever if the timeout is
			 * too big; see comment on MAX_EPOLL_TIMEOUT_MSEC. */
			timeout = MAX_EPOLL_TIMEOUT_MSEC;
		}
	}

	epoll_apply_changes(base);
	event_changelist_remove_all_(&base->changelist, base);

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	res = epoll_wait(epollop->epfd, events, epollop->nevents, timeout);

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (res == -1) {
		if (errno != EINTR) {
			event_warn("epoll_wait");
			return (-1);
		}

		return (0);
	}

	event_debug(("%s: epoll_wait reports %d", __func__, res));
	EVUTIL_ASSERT(res <= epollop->nevents);

	for (i = 0; i < res; i++) {
		int what = events[i].events;
		short ev = 0;
#ifdef USING_TIMERFD
		if (events[i].data.fd == epollop->timerfd)
			continue;
#endif

		if (what & (EPOLLHUP|EPOLLERR)) {
			ev = EV_READ | EV_WRITE;
		} else {
			if (what & EPOLLIN)
				ev |= EV_READ;
			if (what & EPOLLOUT)
				ev |= EV_WRITE;
			if (what & EPOLLRDHUP)
				ev |= EV_CLOSED;
		}

		if (!ev)
			continue;

		evmap_io_active_(base, events[i].data.fd, ev | EV_ET);
	}

	if (res == epollop->nevents && epollop->nevents < MAX_NEVENT) {
		/* We used all of the event space this time.  We should
		   be ready for more events next time. */
		int new_nevents = epollop->nevents * 2;
		struct epoll_event *new_events;

		new_events = mm_realloc(epollop->events,
		    new_nevents * sizeof(struct epoll_event));
		if (new_events) {
			epollop->events = new_events;
			epollop->nevents = new_nevents;
		}
	}

	return (0);
}